

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brotli_bit_stream.cpp
# Opt level: O0

void BuildAndStoreBlockSwitchEntropyCodes
               (BlockEncoder *self,HuffmanTree *tree,size_t *storage_ix,uint8_t *storage)

{
  BlockSplitCode *in_stack_00000488;
  HuffmanTree *in_stack_00000490;
  size_t in_stack_00000498;
  size_t in_stack_000004a0;
  uint32_t *in_stack_000004a8;
  uint8_t *in_stack_000004b0;
  size_t *in_stack_00000620;
  uint8_t *in_stack_00000628;
  
  BuildAndStoreBlockSplitCode
            (in_stack_000004b0,in_stack_000004a8,in_stack_000004a0,in_stack_00000498,
             in_stack_00000490,in_stack_00000488,in_stack_00000620,in_stack_00000628);
  return;
}

Assistant:

static void BuildAndStoreBlockSwitchEntropyCodes(BlockEncoder* self,
    HuffmanTree* tree, size_t* storage_ix, uint8_t* storage) {
  BuildAndStoreBlockSplitCode(self->block_types_, self->block_lengths_,
      self->num_blocks_, self->num_block_types_, tree, &self->block_split_code_,
      storage_ix, storage);
}